

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  uint uVar1;
  ImFontAtlasCustomRect *pIVar2;
  float fVar3;
  float fVar4;
  float fVar6;
  ImVec2 IVar5;
  ImVec2 IVar7;
  float fVar9;
  ImVec2 IVar8;
  ImVec2 IVar10;
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    IVar7 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    pIVar2 = (this->CustomRects).Data + this->PackIdMouseCursors;
    uVar1._0_2_ = pIVar2->X;
    uVar1._2_2_ = pIVar2->Y;
    fVar4 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].x + (float)(uVar1 & 0xffff);
    fVar6 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].y + (float)(uVar1 >> 0x10);
    IVar5 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar7;
    IVar7.x = (this->TexUvScale).x * fVar4;
    IVar7.y = (this->TexUvScale).y * fVar6;
    *out_uv_border = IVar7;
    fVar3 = IVar5.x;
    fVar9 = fVar6 + IVar5.y;
    IVar10.x = (this->TexUvScale).x * (fVar4 + fVar3);
    IVar10.y = (this->TexUvScale).y * fVar9;
    out_uv_border[1] = IVar10;
    IVar5.x = (fVar4 + 123.0) * (this->TexUvScale).x;
    IVar5.y = fVar6 * (this->TexUvScale).y;
    *out_uv_fill = IVar5;
    IVar8.x = (fVar4 + 123.0 + fVar3) * (this->TexUvScale).x;
    IVar8.y = fVar9 * (this->TexUvScale).y;
    out_uv_fill[1] = IVar8;
    return true;
  }
  return false;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(PackIdMouseCursors != -1);
    ImFontAtlasCustomRect* r = GetCustomRectByIndex(PackIdMouseCursors);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r->X, (float)r->Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}